

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor.cpp
# Opt level: O1

Token __thiscall slang::parsing::Preprocessor::nextProcessed(Preprocessor *this)

{
  bool bVar1;
  TokenKind TVar2;
  SyntaxKind SVar3;
  Token token_00;
  Token token;
  Token local_18;
  
  local_18 = nextRaw(this);
  if (this->inMacroBody == false) {
    TVar2 = local_18.kind;
    bVar1 = local_18.kind < MacroQuote;
    if (bVar1) {
      if (TVar2 != Unknown) {
        if (TVar2 != Directive) {
          return local_18;
        }
        if (this->inIfDefCondition == true) {
          SVar3 = Token::directiveKind(&local_18);
          if ((SVar3 - ElseDirective < 0x40) &&
             ((0xa000000000000801U >> ((ulong)(SVar3 - ElseDirective) & 0x3f) & 1) != 0)) {
            return local_18;
          }
          if (SVar3 == ElsIfDirective) {
            return local_18;
          }
        }
      }
    }
    else if ((3 < TVar2 - 0x15a) && (TVar2 != LineContinuation)) {
      return local_18;
    }
    token_00.info = local_18.info;
    token_00.kind = local_18.kind;
    token_00._2_1_ = local_18._2_1_;
    token_00.numFlags.raw = local_18.numFlags.raw;
    token_00.rawLen = local_18.rawLen;
    local_18 = handleDirectives(this,token_00);
  }
  return local_18;
}

Assistant:

Token Preprocessor::nextProcessed() {
    // The core preprocessing routine; this method pulls raw tokens from various text
    // files and converts them into a unified logical stream of sanitized tokens that
    // future stages like a parser can ingest without difficulty.
    //
    // Start off by grabbing the next raw token, either from the current file, an
    // active include file, or an expanded macro.
    auto token = nextRaw();

    // If we're currently within a macro body, return whatever we got right away.
    // If it was a directive it will be deferred until the macro is used.
    if (inMacroBody)
        return token;

    switch (token.kind) {
        // If we found a directive token, process it and pull another. We don't want
        // to return directives to the caller; we handle them ourselves and turn them
        // into trivia.
        case TokenKind::MacroQuote:
        case TokenKind::MacroTripleQuote:
        case TokenKind::MacroEscapedQuote:
        case TokenKind::MacroPaste:
        case TokenKind::LineContinuation:
        case TokenKind::Unknown:
            return handleDirectives(token);
        case TokenKind::Directive:
            if (inIfDefCondition) {
                switch (token.directiveKind()) {
                    case SyntaxKind::IfDefDirective:
                    case SyntaxKind::IfNDefDirective:
                    case SyntaxKind::ElsIfDirective:
                    case SyntaxKind::ElseDirective:
                    case SyntaxKind::EndIfDirective:
                        return token;
                    default:
                        break;
                }
            }
            return handleDirectives(token);
        default:
            return token;
    }
}